

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

JSValue JS_EvalObject(JSContext *ctx,JSValue this_obj,JSValue val,int flags,int scope_idx)

{
  JSValue val1;
  JSValue this_obj_00;
  JSValue v;
  int iVar1;
  JSValueUnion JVar2;
  undefined8 in_RCX;
  JSContext *in_RDI;
  undefined8 in_R8;
  JSValue JVar3;
  JSValue JVar4;
  size_t len;
  char *str;
  JSValue ret;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  JSValueUnion in_stack_ffffffffffffff88;
  size_t in_stack_ffffffffffffff90;
  char *in_stack_ffffffffffffff98;
  JSContext *in_stack_ffffffffffffffa0;
  int64_t in_stack_ffffffffffffffb0;
  int flags_00;
  undefined4 uStack_2c;
  int scope_idx_00;
  undefined4 uStack_24;
  undefined1 local_10 [16];
  
  flags_00 = (int)in_RCX;
  uStack_2c = (undefined4)((ulong)in_RCX >> 0x20);
  scope_idx_00 = (int)in_R8;
  uStack_24 = (undefined4)((ulong)in_R8 >> 0x20);
  JVar3.tag._0_4_ = scope_idx_00;
  JVar3.u = (JSValueUnion)in_RCX;
  JVar3.tag._4_4_ = uStack_24;
  iVar1 = JS_IsString(JVar3);
  if (iVar1 == 0) {
    v.u._4_4_ = uStack_2c;
    v.u.int32 = flags_00;
    v.tag._0_4_ = scope_idx_00;
    v.tag._4_4_ = uStack_24;
    local_10 = (undefined1  [16])JS_DupValue(in_RDI,v);
  }
  else {
    val1.tag = in_stack_ffffffffffffff90;
    val1.u.ptr = in_stack_ffffffffffffff88.ptr;
    JVar2.ptr = JS_ToCStringLen((JSContext *)
                                CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                                (size_t *)
                                CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),val1);
    if (JVar2.ptr == (void *)0x0) {
      local_10._0_8_ = local_10._4_8_ << 0x20;
      local_10._8_8_ = 6;
    }
    else {
      this_obj_00.tag = in_stack_ffffffffffffffb0;
      this_obj_00.u.ptr = JVar2.ptr;
      JVar3 = JS_EvalInternal(in_stack_ffffffffffffffa0,this_obj_00,in_stack_ffffffffffffff98,
                              in_stack_ffffffffffffff90,(char *)in_stack_ffffffffffffff88.ptr,
                              flags_00,scope_idx_00);
      local_10._0_8_ = JVar3.u;
      JS_FreeCString((JSContext *)local_10._0_8_,(char *)in_stack_ffffffffffffff88.ptr);
      local_10._8_8_ = JVar3.tag;
    }
  }
  JVar4.u = (JSValueUnion)local_10._0_8_;
  JVar4.tag = local_10._8_8_;
  return JVar4;
}

Assistant:

static JSValue JS_EvalObject(JSContext *ctx, JSValueConst this_obj,
                             JSValueConst val, int flags, int scope_idx)
{
    JSValue ret;
    const char *str;
    size_t len;

    if (!JS_IsString(val))
        return JS_DupValue(ctx, val);
    str = JS_ToCStringLen(ctx, &len, val);
    if (!str)
        return JS_EXCEPTION;
    ret = JS_EvalInternal(ctx, this_obj, str, len, "<input>", flags, scope_idx);
    JS_FreeCString(ctx, str);
    return ret;

}